

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parseBooleanLiteral(char *in,char *end,Value **boolean)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *__s2;
  size_t sVar4;
  Value *pVVar5;
  int res;
  size_t len;
  char *start;
  Value **boolean_local;
  char *end_local;
  char *in_local;
  
  *boolean = (Value *)0x0;
  in_local = in;
  if ((in != (char *)0x0) && (in != end)) {
    __s2 = lookForNextToken<char>(in,end);
    for (end_local = __s2; bVar2 = isSeparator<char>(*end_local), pcVar1 = Grammar::BoolTrue,
        !bVar2 && end_local != end; end_local = end_local + 1) {
    }
    sVar4 = strlen(Grammar::BoolTrue);
    iVar3 = strncmp(pcVar1,__s2,sVar4);
    pcVar1 = Grammar::BoolFalse;
    if (iVar3 == 0) {
      pVVar5 = ValueAllocator::allocPrimData(ddl_bool,1);
      *boolean = pVVar5;
      Value::setBool(*boolean,true);
    }
    else {
      sVar4 = strlen(Grammar::BoolFalse);
      iVar3 = strncmp(pcVar1,__s2,sVar4);
      if (iVar3 != 0) {
        *boolean = (Value *)0x0;
        return end_local;
      }
      pVVar5 = ValueAllocator::allocPrimData(ddl_bool,1);
      *boolean = pVVar5;
      Value::setBool(*boolean,false);
    }
    in_local = end_local;
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parseBooleanLiteral( char *in, char *end, Value **boolean ) {
    *boolean = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    in = lookForNextToken( in, end );
    char *start( in );
    size_t len( 0 );
    while( !isSeparator( *in ) && in != end ) {
        ++in;
        ++len;
    }
    ++len;
    int res = ::strncmp( Grammar::BoolTrue, start, strlen( Grammar::BoolTrue ) );
    if( 0 != res ) {
        res = ::strncmp( Grammar::BoolFalse, start, strlen( Grammar::BoolFalse ) );
        if( 0 != res ) {
            *boolean = ddl_nullptr;
            return in;
        }
        *boolean = ValueAllocator::allocPrimData( Value::ddl_bool );
        (*boolean)->setBool( false );
    } else {
        *boolean = ValueAllocator::allocPrimData( Value::ddl_bool );
        (*boolean)->setBool( true );
    }

    return in;
}